

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_35081::Environment::RandomFuse(Environment *this,BitGen *gen)

{
  _Bool _Var1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  shared_ptr<const_upb::Arena> b;
  shared_ptr<const_upb::Arena> a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  undefined8 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_68._16_8_ = (element_type *)0x0;
  local_68._0_8_ = (element_type *)0x64;
  absl::lts_20250127::random_internal::
  DistributionCaller<absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>>
  ::
  Impl<absl::lts_20250127::random_internal::UniformDistributionWrapper<unsigned_long>,unsigned_long&,unsigned_long&>
            (gen,local_68 + 0x10);
  IndexedNonNullArena((Environment *)&stack0xffffffffffffffc8,(size_t)this);
  local_68._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_78 = 100;
  absl::lts_20250127::random_internal::
  DistributionCaller<absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>>
  ::
  Impl<absl::lts_20250127::random_internal::UniformDistributionWrapper<unsigned_long>,unsigned_long&,unsigned_long&>
            (gen,local_68 + 0x10);
  IndexedNonNullArena((Environment *)local_68,(size_t)this);
  _Var1 = upb_Arena_Fuse((local_38->ptr_)._M_t.
                         super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                         super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                         super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl,
                         (((unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)> *)local_68._0_8_)->_M_t).
                         super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                         super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                         super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
  local_78 = CONCAT71(local_78._1_7_,_Var1);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!_Var1) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_68 + 0x10),(internal *)&local_78,
               (AssertionResult *)"upb_Arena_Fuse(a->ptr(), b->ptr())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x15d,(char *)local_68._16_8_);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._16_8_ != &local_48) {
      operator_delete((void *)local_68._16_8_,(ulong)(local_48._M_allocated_capacity + 1));
    }
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

void RandomFuse(absl::BitGen& gen) {
    std::shared_ptr<const upb::Arena> a = RandomNonNullArena(gen);
    std::shared_ptr<const upb::Arena> b = RandomNonNullArena(gen);
    EXPECT_TRUE(upb_Arena_Fuse(a->ptr(), b->ptr()));
  }